

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.h
# Opt level: O1

void UnitTest::_UnitTest_Compare::print(char *str)

{
  undefined8 in_RAX;
  char *pcVar1;
  char *__s;
  size_t sVar2;
  ostream *poVar3;
  char *__s_00;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  pcVar1 = strchr(str,10);
  if (pcVar1 != (char *)0x0) {
    if ((long)pcVar1 - (long)str == 0) {
      uStack_28._0_7_ = CONCAT16(10,(undefined6)uStack_28);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(char *)((long)&uStack_28 + 6),1);
      pcVar1 = _unittest_fail();
      if (pcVar1 == (char *)0x0) {
        std::ios::clear((int)poVar3 + (int)*(undefined8 *)(*(long *)poVar3 + -0x18));
      }
      else {
        sVar2 = strlen(pcVar1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar1,sVar2);
      }
      if (DAT_00106198 == '\0') {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,anon_var_dwarf_3ca3,4);
      }
      pcVar1 = str + 1;
    }
    else {
      __s = strdup(str);
      __s[(long)pcVar1 - (long)str] = '\0';
      if (__s == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1070e0);
      }
      else {
        sVar2 = strlen(__s);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,__s,sVar2);
      }
      uStack_28 = CONCAT17(10,(undefined7)uStack_28);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(char *)((long)&uStack_28 + 7),1);
      __s_00 = _unittest_fail();
      if (__s_00 == (char *)0x0) {
        std::ios::clear((int)poVar3 + (int)*(undefined8 *)(*(long *)poVar3 + -0x18));
      }
      else {
        sVar2 = strlen(__s_00);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,__s_00,sVar2);
      }
      if (DAT_00106198 == '\0') {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,anon_var_dwarf_3ca3,4);
      }
      free(__s);
      pcVar1 = pcVar1 + 1;
    }
    print(pcVar1);
    return;
  }
  if (str != (char *)0x0) {
    sVar2 = strlen(str);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,str,sVar2);
    return;
  }
  std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1070e0);
  return;
}

Assistant:

static void print(const char *str) {
    const char *pos = 0;
    if (0 != (pos = std::strchr(str, '\n'))) {
      if (pos == str) {
        std::cout << '\n' << _unittest_fail();
        if (!global_unit_test_object_.vim_lines) {
          std::cout << "│ ";
        }
        print(&str[1]);
      } else {
        char *left = strdup(str);
        left[pos - str] = '\0';
        std::cout << left << '\n' << _unittest_fail();
        if (!global_unit_test_object_.vim_lines) {
          std::cout << "│ ";
        }
        free(left);
        print(&pos[1]);
      }
    } else {
      std::cout << str;
    }
  }